

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlParserErrors
xmlCreateCharEncodingHandler
          (char *name,xmlCharEncFlags flags,xmlCharEncConvImpl impl,void *implCtxt,
          xmlCharEncodingHandler **out)

{
  xmlCharEncoding xVar1;
  char *pcVar2;
  xmlCharEncoding enc;
  char *nalias;
  char *norig;
  xmlCharEncodingHandler *handler;
  xmlCharEncodingHandler **out_local;
  void *implCtxt_local;
  xmlCharEncConvImpl impl_local;
  char *pcStack_18;
  xmlCharEncFlags flags_local;
  char *name_local;
  
  if (out == (xmlCharEncodingHandler **)0x0) {
    name_local._4_4_ = XML_ERR_ARGUMENT;
  }
  else {
    *out = (xmlCharEncodingHandler *)0x0;
    if ((name == (char *)0x0) || (flags == 0)) {
      name_local._4_4_ = XML_ERR_ARGUMENT;
    }
    else {
      pcVar2 = xmlGetEncodingAlias(name);
      pcStack_18 = name;
      if (pcVar2 != (char *)0x0) {
        pcStack_18 = pcVar2;
      }
      xVar1 = xmlParseCharEncodingInternal(pcStack_18);
      if (xVar1 == XML_CHAR_ENCODING_UTF8) {
        name_local._4_4_ = XML_ERR_OK;
      }
      else {
        if ((XML_CHAR_ENCODING_NONE < xVar1) && ((uint)xVar1 < 0x1f)) {
          if ((((flags & XML_ENC_INPUT) == 0) ||
              (defaultHandlers[xVar1].input.func != (xmlCharEncConvFunc)0x0)) &&
             (((flags & XML_ENC_OUTPUT) == 0 ||
              (defaultHandlers[xVar1].output.func != (xmlCharEncConvFunc)0x0)))) {
            *out = defaultHandlers + xVar1;
            return XML_ERR_OK;
          }
        }
        name_local._4_4_ = xmlFindExtraHandler(name,pcStack_18,flags,impl,implCtxt,out);
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

xmlParserErrors
xmlCreateCharEncodingHandler(const char *name, xmlCharEncFlags flags,
                             xmlCharEncConvImpl impl, void *implCtxt,
                             xmlCharEncodingHandler **out) {
    const xmlCharEncodingHandler *handler;
    const char *norig, *nalias;
    xmlCharEncoding enc;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;

    if ((name == NULL) || (flags == 0))
        return(XML_ERR_ARGUMENT);

    norig = name;
    nalias = xmlGetEncodingAlias(name);
    if (nalias != NULL)
	name = nalias;

    enc = xmlParseCharEncodingInternal(name);

    /* Return NULL handler for UTF-8 */
    if (enc == XML_CHAR_ENCODING_UTF8)
        return(XML_ERR_OK);

    if ((enc > 0) && ((size_t) enc < NUM_DEFAULT_HANDLERS)) {
        handler = &defaultHandlers[enc];
        if ((((flags & XML_ENC_INPUT) == 0) || (handler->input.func)) &&
            (((flags & XML_ENC_OUTPUT) == 0) || (handler->output.func))) {
            *out = (xmlCharEncodingHandler *) handler;
            return(XML_ERR_OK);
        }
    }

    return(xmlFindExtraHandler(norig, name, flags, impl, implCtxt, out));
}